

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::UniformBufferStorageTestCase::execute
          (UniformBufferStorageTestCase *this,GLuint sparse_bo_storage_flags)

{
  GLenum GVar1;
  TestError *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar2;
  bool bVar3;
  byte local_1f1;
  MessageBuilder local_1d8;
  uint local_54;
  uint local_50;
  uint retrieved_value;
  uint expected_value;
  uint uStack_44;
  bool is_ub_data_physically_backed;
  uint n_vertex;
  uint ubo_data_offset;
  uint *result_data_ptr;
  uint local_28;
  uint local_24;
  uint ubo_commit_start_offset;
  uint ubo_commit_size;
  bool result_local;
  uint n_iteration;
  bool result;
  UniformBufferStorageTestCase *pUStack_10;
  GLuint sparse_bo_storage_flags_local;
  UniformBufferStorageTestCase *this_local;
  
  result_local = true;
  n_iteration = sparse_bo_storage_flags;
  pUStack_10 = this;
  (*this->m_gl->bindBufferRange)
            (0x8a11,0,this->m_sparse_bo,(ulong)this->m_sparse_bo_data_start_offset,
             (ulong)this->m_sparse_bo_data_size);
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"glBindBufferBase() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x1880);
  ubo_commit_size = 0;
  do {
    if (2 < ubo_commit_size) {
      return (bool)(result_local & 1);
    }
    ubo_commit_start_offset._3_1_ = 1;
    local_24 = 0;
    local_28 = 0;
    if (ubo_commit_size == 0) {
      local_24 = this->m_sparse_bo_data_size;
      local_28 = this->m_sparse_bo_data_start_offset;
    }
    else if (ubo_commit_size == 1) {
      local_24 = this->m_sparse_bo_data_size >> 1;
      local_28 = this->m_sparse_bo_data_start_offset;
    }
    else if (ubo_commit_size != 2) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid iteration index",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                 ,0x18ac);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (*this->m_gl->bufferPageCommitmentARB)(0x8a11,(ulong)local_28,(ulong)local_24,'\x01');
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glBufferPageCommitmentARB() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0x18b1);
    (*this->m_gl->copyBufferSubData)(0x8f36,0x8f37,0,(ulong)local_28,(ulong)local_24);
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glCopyBufferSubData() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0x18b6);
    (*this->m_gl->useProgram)(this->m_po);
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glUseProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0x18ba);
    (*this->m_gl->beginTransformFeedback)(0);
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glBeginTransformFeedback() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0x18bd);
    (*this->m_gl->drawArrays)(0,0,this->m_n_ubo_uints);
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glDrawArrays() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0x18c1);
    (*this->m_gl->endTransformFeedback)();
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glEndTransformFeedback() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0x18c4);
    _n_vertex = (*this->m_gl->mapBuffer)(0x8c8e,35000);
    uStack_44 = this->m_sparse_bo_data_start_offset;
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glMapBuffer() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0x18cb);
    expected_value = 0;
    while( true ) {
      local_1f1 = 0;
      if (expected_value < this->m_n_ubo_uints) {
        local_1f1 = ubo_commit_start_offset._3_1_;
      }
      if ((local_1f1 & 1) == 0) break;
      bVar3 = uStack_44 < local_28 + local_24;
      retrieved_value._3_1_ = local_28 <= uStack_44 && bVar3;
      local_54 = *(uint *)((long)_n_vertex + (ulong)expected_value * 4);
      if (local_28 <= uStack_44 && bVar3) {
        local_50 = 1;
      }
      else {
        local_50 = (uint)(expected_value == 0);
      }
      if (local_50 != local_54) {
        this_01 = tcu::TestContext::getLog(this->m_testCtx);
        tcu::TestLog::operator<<(&local_1d8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar2 = tcu::MessageBuilder::operator<<(&local_1d8,(char (*) [16])"Invalid value (");
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_54);
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [19])") found at index (");
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&expected_value);
        pMVar2 = tcu::MessageBuilder::operator<<
                           (pMVar2,(char (*) [35])"), instead of the expected value (");
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_50);
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [21])"). Iteration index:(");
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&ubo_commit_size);
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])0x2a94734);
        tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1d8);
        ubo_commit_start_offset._3_1_ = 0;
      }
      expected_value = expected_value + 1;
      uStack_44 = uStack_44 + 4;
    }
    result_local = (result_local & 1U & ubo_commit_start_offset._3_1_ & 1) != 0;
    (*this->m_gl->unmapBuffer)(0x8c8e);
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glUnmapBuffer() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0x18fc);
    (*this->m_gl->clearBufferData)(0x8c8e,0x8229,0x1903,0x1401,"");
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glClearBufferData() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0x18ff);
    (*this->m_gl->bufferPageCommitmentARB)(0x8a11,0,(ulong)this->m_sparse_bo_size_rounded,'\0');
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glBufferPageCommitmentARB() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0x1902);
    ubo_commit_size = ubo_commit_size + 1;
  } while( true );
}

Assistant:

bool UniformBufferStorageTestCase::execute(glw::GLuint sparse_bo_storage_flags)
{
	(void)sparse_bo_storage_flags;
	bool result = true;

	m_gl.bindBufferRange(GL_UNIFORM_BUFFER, 0, /* index */
						 m_sparse_bo, m_sparse_bo_data_start_offset, m_sparse_bo_data_size);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBufferBase() call failed.");

	/* Run the test in three iterations:
	 *
	 * 1) Whole UBO storage is backed by physical backing.
	 * 2) Half the UBO storage is backed by physical backing.
	 * 3) None of the UBO storage is backed by physical backing.
	 */
	for (unsigned int n_iteration = 0; n_iteration < 3; ++n_iteration)
	{
		bool		 result_local			 = true;
		unsigned int ubo_commit_size		 = 0;
		unsigned int ubo_commit_start_offset = 0;

		switch (n_iteration)
		{
		case 0:
		{
			ubo_commit_size			= m_sparse_bo_data_size;
			ubo_commit_start_offset = m_sparse_bo_data_start_offset;

			break;
		}

		case 1:
		{
			DE_ASSERT((m_sparse_bo_data_size % 2) == 0);
			DE_ASSERT((m_sparse_bo_data_size % m_page_size) == 0);

			ubo_commit_size			= m_sparse_bo_data_size / 2;
			ubo_commit_start_offset = m_sparse_bo_data_start_offset;

			break;
		}

		case 2:
		{
			/* The default values do just fine */

			break;
		}

		default:
		{
			TCU_FAIL("Invalid iteration index");
		}
		} /* switch (n_iteration) */

		m_gl.bufferPageCommitmentARB(GL_UNIFORM_BUFFER, ubo_commit_start_offset, ubo_commit_size, GL_TRUE); /* commit */
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferPageCommitmentARB() call failed.");

		/* Copy the UBO data */
		m_gl.copyBufferSubData(GL_COPY_READ_BUFFER, GL_COPY_WRITE_BUFFER, 0, /* readOffset */
							   ubo_commit_start_offset, ubo_commit_size);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glCopyBufferSubData() call failed.");

		/* Issue the draw call to execute the test */
		m_gl.useProgram(m_po);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glUseProgram() call failed.");

		m_gl.beginTransformFeedback(GL_POINTS);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBeginTransformFeedback() call failed.");

		m_gl.drawArrays(GL_POINTS, 0, /* first */
						m_n_ubo_uints);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glDrawArrays() call failed.");

		m_gl.endTransformFeedback();
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glEndTransformFeedback() call failed.");

		/* Retrieve the data, verify the output */
		const unsigned int* result_data_ptr =
			(const unsigned int*)m_gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
		unsigned int ubo_data_offset = m_sparse_bo_data_start_offset;

		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glMapBuffer() call failed.");

		for (unsigned int n_vertex = 0; n_vertex < m_n_ubo_uints && result_local;
			 ++n_vertex, ubo_data_offset = static_cast<unsigned int>(ubo_data_offset + sizeof(unsigned int)))
		{
			const bool is_ub_data_physically_backed = (ubo_data_offset >= ubo_commit_start_offset &&
													   ubo_data_offset < (ubo_commit_start_offset + ubo_commit_size)) ?
														  1 :
														  0;
			unsigned int	   expected_value  = -1;
			const unsigned int retrieved_value = result_data_ptr[n_vertex];

			if (is_ub_data_physically_backed)
			{
				expected_value = 1;
			}
			else
			{
				/* Read ops applied against non-committed sparse buffers should return 0, so the comparison
				 * performed in the vertex shader should result in 1 being written to the TF region.
				 */
				expected_value = (n_vertex == 0) ? 1 : 0;
			}

			if (expected_value != retrieved_value)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Invalid value "
															   "("
								   << retrieved_value << ") "
														 "found at index "
														 "("
								   << n_vertex << ")"
												  ", instead of the expected value "
												  "("
								   << expected_value << ")"
														". Iteration index:"
														"("
								   << n_iteration << ")" << tcu::TestLog::EndMessage;

				result_local = false;
			}
		}

		result &= result_local;

		/* Clean up in anticipation for the next iteration */
		static const unsigned char data_zero_r8 = 0;

		m_gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glUnmapBuffer() call failed.");

		m_gl.clearBufferData(GL_TRANSFORM_FEEDBACK_BUFFER, GL_R8, GL_RED, GL_UNSIGNED_BYTE, &data_zero_r8);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glClearBufferData() call failed.");

		m_gl.bufferPageCommitmentARB(GL_UNIFORM_BUFFER, 0, m_sparse_bo_size_rounded, GL_FALSE); /* commit */
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferPageCommitmentARB() call failed.");
	} /* for (all three iterations) */

	return result;
}